

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

int __thiscall ncnn::Deconvolution::load_param(Deconvolution *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0x80) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,0);
  *(int *)(in_RDI + 0x84) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xb,*(int *)(in_RDI + 0x84));
  *(int *)(in_RDI + 0x88) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,1);
  *(int *)(in_RDI + 0x8c) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xc,*(int *)(in_RDI + 0x8c));
  *(int *)(in_RDI + 0x90) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,1);
  *(int *)(in_RDI + 0x94) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xd,*(int *)(in_RDI + 0x94));
  *(int *)(in_RDI + 0x98) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,0);
  *(int *)(in_RDI + 0x9c) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xe,*(int *)(in_RDI + 0x9c));
  *(int *)(in_RDI + 0xa0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,5,0);
  *(int *)(in_RDI + 0xa4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,6,0);
  *(int *)(in_RDI + 0xa8) = iVar1;
  return 0;
}

Assistant:

int Deconvolution::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    pad_w = pd.get(4, 0);
    pad_h = pd.get(14, pad_w);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);

    return 0;
}